

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void test_internal(string *data)

{
  ulong uVar1;
  logic_error *this;
  exception *e;
  string *data_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    return;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"Got empty data");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void test_internal(const std::string& data) {
	try {
		// Check that it actually got anything
		if (data.empty()) {
			throw std::logic_error("Got empty data");
		}
	}
	catch (const std::exception& e)   {
		// Take any standard exception & output its message
		std::cerr << e.what() << std::endl;
		std::exit(EXIT_FAILURE);
	}
	catch (...)   {
		// If any non-std exception is thrown, also fail
		std::cerr << "Unknown exception!" << std::endl;
		std::exit(EXIT_FAILURE);
	}
}